

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char (*in_stack_fffffffffffffec8) [15];
  undefined1 local_130 [16];
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  local_60[0] = NullSafeStringView("Option \"");
  local_90.piece_._M_len = (size_t)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_90.piece_._M_str = (char *)(~local_90.piece_._M_len + *(long *)(**(long **)this + 8));
  local_c0.piece_ =
       NullSafeStringView("\" is a message. To set the entire message, use syntax like \"");
  local_f0.piece_._M_len = (size_t)**(ushort **)(**(long **)this + 8);
  local_f0.piece_._M_str =
       (char *)(~local_f0.piece_._M_len + (long)*(ushort **)(**(long **)this + 8));
  local_120.piece_ =
       NullSafeStringView(
                         " = { <proto text format> }\". To set fields within it, use syntax like \""
                         );
  local_130._0_8_ = ZEXT28(**(ushort **)(**(long **)this + 8));
  local_130._8_8_ = ~local_130._0_8_ + (long)*(ushort **)(**(long **)this + 8);
  StrCat<std::basic_string_view<char,std::char_traits<char>>,char[15]>
            (__return_storage_ptr__,(lts_20250127 *)local_60,&local_90,&local_c0,&local_f0,
             &local_120,(AlphaNum *)local_130,
             (basic_string_view<char,_std::char_traits<char>_> *)".foo = value\".",
             in_stack_fffffffffffffec8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}